

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkset_tpl.h
# Opt level: O0

uint8_t * chunkcopy_sse2(uint8_t *out,uint8_t *from,uint len)

{
  int iVar1;
  int in_EDX;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  int32_t align;
  chunk_t chunk;
  longlong local_28 [2];
  int local_14;
  uint8_t *local_10;
  uint8_t *local_8;
  
  iVar1 = (in_EDX - 1U & 0xf) + 1;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  loadchunk(in_RSI,&local_28);
  storechunk(local_8,&local_28);
  local_8 = local_8 + iVar1;
  local_10 = local_10 + iVar1;
  for (local_14 = local_14 - iVar1; local_14 != 0; local_14 = local_14 + -0x10) {
    loadchunk(local_10,&local_28);
    storechunk(local_8,&local_28);
    local_8 = local_8 + 0x10;
    local_10 = local_10 + 0x10;
  }
  return local_8;
}

Assistant:

static inline uint8_t* CHUNKCOPY(uint8_t *out, uint8_t const *from, unsigned len) {
    Assert(len > 0, "chunkcopy should never have a length 0");
    chunk_t chunk;
    int32_t align = ((len - 1) % sizeof(chunk_t)) + 1;
    loadchunk(from, &chunk);
    storechunk(out, &chunk);
    out += align;
    from += align;
    len -= align;
    while (len > 0) {
        loadchunk(from, &chunk);
        storechunk(out, &chunk);
        out += sizeof(chunk_t);
        from += sizeof(chunk_t);
        len -= sizeof(chunk_t);
    }
    return out;
}